

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_physfs.c
# Opt level: O3

int cmd_crc32(char *args)

{
  size_t sVar1;
  long lVar2;
  ulong uVar3;
  undefined8 uVar4;
  PHYSFS_uint32 i;
  ulong uVar5;
  byte bVar6;
  uint uVar7;
  int iVar8;
  char *pcVar9;
  PHYSFS_uint8 buffer [512];
  byte local_228 [520];
  
  pcVar9 = args;
  if (*args == '\"') {
    pcVar9 = args + 1;
    sVar1 = strlen(pcVar9);
    args[sVar1] = '\0';
  }
  lVar2 = PHYSFS_openRead(pcVar9);
  if (lVar2 == 0) {
    uVar4 = PHYSFS_getLastError();
    pcVar9 = "failed to open. Reason: [%s].\n";
  }
  else {
    uVar3 = PHYSFS_readBytes(lVar2,local_228,0x200);
    if ((long)uVar3 < 1) {
      uVar7 = 0;
    }
    else {
      uVar7 = 0xffffffff;
      do {
        uVar5 = 0;
        do {
          bVar6 = local_228[uVar5];
          iVar8 = 8;
          do {
            uVar7 = -((uVar7 ^ bVar6) & 1) & 0xedb88320 ^ uVar7 >> 1;
            bVar6 = bVar6 >> 1;
            iVar8 = iVar8 + -1;
          } while (iVar8 != 0);
          local_228[uVar5] = bVar6;
          uVar5 = (ulong)((int)uVar5 + 1);
        } while (uVar5 < uVar3);
        uVar3 = PHYSFS_readBytes(lVar2,local_228,0x200);
      } while (0 < (long)uVar3);
      uVar7 = ~uVar7;
    }
    if (-1 < (long)uVar3) {
      PHYSFS_close(lVar2);
      printf("CRC32 for %s: 0x%08X\n",pcVar9,(ulong)uVar7);
      return 1;
    }
    uVar4 = PHYSFS_getLastError();
    pcVar9 = "error while reading. Reason: [%s].\n";
  }
  printf(pcVar9,uVar4);
  return 1;
}

Assistant:

static int cmd_crc32(char *args)
{
    PHYSFS_File *f;

    if (*args == '\"')
    {
        args++;
        args[strlen(args) - 1] = '\0';
    } /* if */

    f = PHYSFS_openRead(args);
    if (f == NULL)
        printf("failed to open. Reason: [%s].\n", PHYSFS_getLastError());
    else
    {
        PHYSFS_uint8 buffer[CRC32_BUFFERSIZE];
        PHYSFS_uint32 crc = -1;
        PHYSFS_sint64 bytesread;

        while ((bytesread = PHYSFS_readBytes(f, buffer, CRC32_BUFFERSIZE)) > 0)
        {
            PHYSFS_uint32 i, bit;
            for (i = 0; i < bytesread; i++)
            {
                for (bit = 0; bit < 8; bit++, buffer[i] >>= 1)
                    crc = (crc >> 1) ^ (((crc ^ buffer[i]) & 1) ? 0xEDB88320 : 0);
            } /* for */
        } /* while */

        if (bytesread < 0)
        {
            printf("error while reading. Reason: [%s].\n",
                   PHYSFS_getLastError());
            return 1;
        } /* if */

        PHYSFS_close(f);

        crc ^= -1;
        printf("CRC32 for %s: 0x%08X\n", args, crc);
    } /* else */

    return 1;
}